

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

bool cmQtAutoGenerator::FileDiffers(string *filename,string *content)

{
  undefined1 uVar1;
  bool bVar2;
  __type _Var3;
  undefined1 local_40 [8];
  string oldContents;
  bool differs;
  string *content_local;
  string *filename_local;
  
  oldContents.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::string((string *)local_40);
  bVar2 = FileRead((string *)local_40,filename,(string *)0x0);
  if ((bVar2) &&
     (_Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,content), _Var3)) {
    oldContents.field_2._M_local_buf[0xf] = '\0';
  }
  uVar1 = oldContents.field_2._M_local_buf[0xf];
  std::__cxx11::string::~string((string *)local_40);
  return (bool)(uVar1 & 1);
}

Assistant:

bool cmQtAutoGenerator::FileDiffers(std::string const& filename,
                                    std::string const& content)
{
  bool differs = true;
  std::string oldContents;
  if (FileRead(oldContents, filename) && (oldContents == content)) {
    differs = false;
  }
  return differs;
}